

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O0

Promise<unsigned_long> __thiscall
kj::anon_unknown_31::HttpConnectionCloseEntityReader::tryRead
          (HttpConnectionCloseEntityReader *this,void *buffer,size_t minBytes,size_t maxBytes)

{
  bool bVar1;
  PromiseNode *extraout_RDX;
  PromiseNode *extraout_RDX_00;
  PromiseNode *pPVar2;
  Promise<unsigned_long> PVar3;
  size_t local_50;
  void *local_48;
  size_t maxBytes_local;
  size_t minBytes_local;
  void *buffer_local;
  HttpConnectionCloseEntityReader *this_local;
  
  maxBytes_local = maxBytes;
  minBytes_local = minBytes;
  buffer_local = buffer;
  this_local = this;
  bVar1 = HttpEntityBodyReader::alreadyDone((HttpEntityBodyReader *)buffer);
  if (bVar1) {
    Promise<unsigned_long>::Promise((Promise<unsigned_long> *)this,0);
    pPVar2 = extraout_RDX;
  }
  else {
    HttpInputStreamImpl::tryRead
              ((HttpInputStreamImpl *)&stack0xffffffffffffffc0,*(void **)((long)buffer + 8),
               minBytes_local,maxBytes_local);
    local_50 = maxBytes_local;
    local_48 = buffer;
    Promise<unsigned_long>::
    then<kj::(anonymous_namespace)::HttpConnectionCloseEntityReader::tryRead(void*,unsigned_long,unsigned_long)::_lambda(unsigned_long)_1_,kj::_::PropagateException>
              ((Promise<unsigned_long> *)this,(Type *)&stack0xffffffffffffffc0,
               (PropagateException *)&local_50);
    Promise<unsigned_long>::~Promise((Promise<unsigned_long> *)&stack0xffffffffffffffc0);
    pPVar2 = extraout_RDX_00;
  }
  PVar3.super_PromiseBase.node.ptr = pPVar2;
  PVar3.super_PromiseBase.node.disposer = (Disposer *)this;
  return (Promise<unsigned_long>)PVar3.super_PromiseBase.node;
}

Assistant:

Promise<size_t> tryRead(void* buffer, size_t minBytes, size_t maxBytes) override {
    if (alreadyDone()) return size_t(0);

    return inner.tryRead(buffer, minBytes, maxBytes)
        .then([=](size_t amount) {
      if (amount < minBytes) {
        doneReading();
      }
      return amount;
    });
  }